

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

double __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::CalcPeaks
          (ChISO2631_Shock_SeatCushionLogger *this,vector<double,_std::allocator<double>_> *v,
          bool vertical)

{
  pointer pdVar1;
  size_t k;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar5 = 0.0;
  uVar2 = 0;
  uVar3 = 0;
  do {
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) - 1U <= uVar3) {
      dVar5 = pow(dVar5,0.16666666666666666);
      return dVar5;
    }
    dVar4 = pdVar1[uVar3];
    if ((dVar4 <= 0.0) || (0.0 <= pdVar1[uVar3 + 1])) {
      if (dVar4 < 0.0) {
        if (0.0 < pdVar1[uVar3 + 1]) goto LAB_00e45ceb;
      }
    }
    else {
LAB_00e45ceb:
      auVar6 = ZEXT864(0);
      if (dVar4 < 0.0 && !vertical) {
        while (dVar4 = auVar6._0_8_, uVar2 <= uVar3) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar1[uVar2];
          uVar2 = uVar2 + 1;
          auVar8 = vminsd_avx(auVar8,auVar6._0_16_);
          auVar6 = ZEXT1664(auVar8);
        }
      }
      else {
        while (dVar4 = auVar6._0_8_, uVar2 <= uVar3) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar1[uVar2];
          uVar2 = uVar2 + 1;
          auVar8 = vmaxsd_avx(auVar7,auVar6._0_16_);
          auVar6 = ZEXT1664(auVar8);
        }
      }
      dVar4 = pow(dVar4,6.0);
      dVar5 = dVar5 + dVar4;
      uVar2 = uVar3;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

double ChISO2631_Shock_SeatCushionLogger::CalcPeaks(std::vector<double>& v, bool vertical) {
    double d = 0.0;
    size_t id1 = 0;
    size_t id2 = 0;
    double mx;
    for (size_t i = 0; i < v.size() - 1; i++) {
        id2 = i;
        if ((v[i] > 0 && v[i + 1] < 0) || (v[i] < 0 && v[i + 1] > 0)) {
            if (v[id2] < 0 && !vertical) {
                mx = 0.0;
                for (size_t k = id1; k <= id2; k++) {
                    if (v[k] < mx) {
                        mx = v[k];
                    }
                }
            } else {
                mx = 0.0;
                for (size_t k = id1; k <= id2; k++) {
                    if (v[k] > mx) {
                        mx = v[k];
                    }
                }
            }
            d += pow(mx, 6.0);
            id1 = id2;
        }
    }

    return pow(d, 1.0 / 6.0);
}